

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  VtabCtx *pVVar1;
  Table *pTVar2;
  char *p;
  int iVar3;
  Table *pNew;
  Index *pIVar4;
  char *zFormat;
  uint uVar5;
  char *zErr;
  Parse sParse;
  char *local_1d8;
  Parse local_1d0;
  
  local_1d8 = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pVVar1 = db->pVtabCtx;
  if ((pVVar1 == (VtabCtx *)0x0) || (pVVar1->bDeclared != 0)) {
    db->errCode = 0x15;
    uVar5 = 0x15;
    sqlite3ErrorFinish(db,0x15);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x20f90,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  else {
    pTVar2 = pVVar1->pTab;
    memset(&local_1d0,0,0x1a0);
    local_1d0.eParseMode = '\x01';
    local_1d0.nQueryLoop = 1;
    local_1d0.db = db;
    iVar3 = sqlite3RunParser(&local_1d0,zCreateTable,&local_1d8);
    p = local_1d8;
    if ((local_1d0.pNewTable == (Table *)0x0 || iVar3 != 0) ||
       (((db->mallocFailed != '\0' || ((local_1d0.pNewTable)->pSelect != (Select *)0x0)) ||
        ((local_1d0.pNewTable)->nModuleArg != 0)))) {
      zFormat = "%s";
      if (local_1d8 == (char *)0x0) {
        zFormat = (char *)0x0;
      }
      uVar5 = 1;
      sqlite3ErrorWithMsg(db,1,zFormat,local_1d8);
      if (p != (char *)0x0) {
        sqlite3DbFreeNN(db,p);
      }
    }
    else {
      uVar5 = 0;
      if (pTVar2->aCol == (Column *)0x0) {
        pTVar2->aCol = (local_1d0.pNewTable)->aCol;
        pTVar2->nCol = (local_1d0.pNewTable)->nCol;
        pTVar2->tabFlags = pTVar2->tabFlags | (local_1d0.pNewTable)->tabFlags & 0x60;
        (local_1d0.pNewTable)->nCol = 0;
        (local_1d0.pNewTable)->aCol = (Column *)0x0;
        uVar5 = 0;
        if ((((local_1d0.pNewTable)->tabFlags & 0x20) != 0) &&
           (pVVar1->pVTable->pMod->pModule->xUpdate !=
            (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)) {
          for (pIVar4 = (local_1d0.pNewTable)->pIndex;
              (pIVar4 != (Index *)0x0 && ((*(ushort *)&pIVar4->field_0x63 & 3) != 2));
              pIVar4 = pIVar4->pNext) {
          }
          uVar5 = (uint)(pIVar4->nKeyCol != 1);
        }
        pIVar4 = (local_1d0.pNewTable)->pIndex;
        if (pIVar4 != (Index *)0x0) {
          pTVar2->pIndex = pIVar4;
          (local_1d0.pNewTable)->pIndex = (Index *)0x0;
          pIVar4->pTable = pTVar2;
        }
      }
      pVVar1->bDeclared = 1;
    }
    local_1d0.eParseMode = '\0';
    if (local_1d0.pVdbe != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_1d0.pVdbe);
    }
    sqlite3DeleteTable(db,local_1d0.pNewTable);
    sqlite3ParserReset(&local_1d0);
    if (db->mallocFailed == '\0') {
      uVar5 = uVar5 & db->errMask;
    }
    else {
      apiOomError(db);
      uVar5 = 7;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar5;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  char *zErr = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  memset(&sParse, 0, sizeof(sParse));
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.db = db;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable, &zErr) 
   && sParse.pNewTable
   && !db->mallocFailed
   && !sParse.pNewTable->pSelect
   && !IsVirtual(sParse.pNewTable)
  ){
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR, (zErr ? "%s" : 0), zErr);
    sqlite3DbFree(db, zErr);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParserReset(&sParse);

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}